

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

bool __thiscall
duckdb::ParquetReader::ScanInternal
          (ParquetReader *this,ClientContext *context,ParquetReaderScanState *state,
          DataChunk *result)

{
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *this_00;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *this_01;
  vector<duckdb::ParquetScanFilter,_true> *this_02;
  idx_t iVar1;
  size_type __n;
  TableFilter *pTVar2;
  MultiFileLocalColumnId params;
  ParquetReaderScanState *pPVar3;
  unsigned_long uVar4;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_03;
  _Bit_type *this_04;
  int iVar5;
  ParquetRowGroup *pPVar6;
  pointer pCVar7;
  ParquetReader *pPVar8;
  pointer pDVar9;
  pointer pAVar10;
  AdaptiveFilterState state_00;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  ColumnReader *pCVar15;
  type pTVar16;
  long lVar17;
  idx_t iVar18;
  StructColumnReader *pSVar19;
  undefined4 extraout_var;
  uint64_t len;
  uint64_t uVar20;
  undefined4 extraout_var_00;
  InvalidInputException *this_05;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  *this_06;
  iterator iVar21;
  pointer pTVar22;
  IOException *this_07;
  idx_t i_1;
  unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>,_true> *this_08;
  ulong uVar23;
  idx_t i;
  ulong i_00;
  _Bit_type *__n_00;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  reference rVar28;
  idx_t filter_count;
  StructColumnReader *local_d8;
  ParquetReaderScanState *local_d0;
  allocator_type local_c2;
  bool local_c1;
  unsigned_long local_c0;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *local_b8;
  SelectionVector *local_b0;
  MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *local_a8;
  data_ptr_t local_a0;
  unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true> *local_98;
  vector<bool,_true> need_to_read;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (state->finished == false) {
    lVar17 = state->current_group;
    local_d0 = state;
    if (lVar17 < 0) {
LAB_01ebefd8:
      state->current_group = lVar17 + 1;
      state->offset_in_group = 0;
      ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                      *)&need_to_read,
                     &(((state->thrift_file_proto)._M_t.
                        super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                        .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>.
                       _M_head_impl)->ptrans_).
                      super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                    );
      this_04 = need_to_read.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_p;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &need_to_read.super_vector<bool,_std::allocator<bool>_>.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_offset);
      ThriftFileTransport::ClearPrefetch((ThriftFileTransport *)this_04);
      state->current_group_prefetched = false;
      if (state->current_group ==
          (long)(state->group_idx_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(state->group_idx_list).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) {
LAB_01ebf027:
        state->finished = true;
        goto LAB_01ebf02b;
      }
      this_00 = &state->root_reader;
      pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(this_00);
      pPVar8 = ColumnReader::Reader(pCVar7);
      pvVar11 = vector<unsigned_long,_true>::get<true>(&state->group_idx_list,state->current_group);
      iVar18 = GetRowGroupOffset(pPVar8,*pvVar11);
      state->group_offset = iVar18;
      this_01 = &(this->super_BaseFileReader).column_ids;
      uVar23 = 0;
      for (i_00 = 0; pPVar3 = local_d0,
          i_00 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               .
                               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_BaseFileReader).column_ids.column_ids.
                               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               .
                               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); i_00 = i_00 + 1) {
        PrepareRowGroupBuffer(this,local_d0,i_00);
        pvVar13 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>(&this_01->column_ids,i_00)
        ;
        iVar18 = pvVar13->column_id;
        pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                 operator->(this_00);
        pSVar19 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar7);
        pCVar15 = StructColumnReader::GetChildReader(pSVar19,iVar18);
        iVar5 = (*pCVar15->_vptr_ColumnReader[8])(pCVar15);
        uVar23 = uVar23 + CONCAT44(extraout_var,iVar5);
      }
      pPVar6 = GetGroup(this,local_d0);
      if (pPVar3->prefetch_mode == false) {
        return true;
      }
      if (pPVar3->offset_in_group == pPVar6->num_rows) {
        return true;
      }
      len = GetGroupSpan(this,pPVar3);
      pPVar3 = local_d0;
      if (len < uVar23) {
        this_07 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&need_to_read,
                   "The parquet file \'%s\' seems to have incorrectly set page offsets. This interferes with DuckDB\'s prefetching optimization. DuckDB may still be able to scan this file by manually disabling the prefetching mechanism using: \'SET disable_parquet_prefetching=true\'."
                   ,(allocator *)&filter_count);
        ::std::__cxx11::string::string
                  ((string *)&local_50,(string *)&(this->super_BaseFileReader).file);
        IOException::IOException<std::__cxx11::string>(this_07,(string *)&need_to_read,&local_50);
        __cxa_throw(this_07,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_d8 = (StructColumnReader *)
                 (this->super_BaseFileReader).filters.
                 super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
                 .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
      if ((local_d8 != (StructColumnReader *)0x0) ||
         (auVar26._8_4_ = (int)(uVar23 >> 0x20), auVar26._0_8_ = uVar23, auVar26._12_4_ = 0x45300000
         , auVar27._8_4_ = (int)(len >> 0x20), auVar27._0_8_ = len, auVar27._12_4_ = 0x45300000,
         ((auVar26._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0)) /
         ((auVar27._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0)) <= 0.95)) {
        local_b8 = &(this->super_BaseFileReader).filters;
        for (__n_00 = (_Bit_type *)0x0;
            __n_00 < (_Bit_type *)
                     ((long)(this->super_BaseFileReader).column_ids.column_ids.
                            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            .
                            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_BaseFileReader).column_ids.column_ids.
                            super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            .
                            super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
            __n_00 = (_Bit_type *)((long)__n_00 + 1)) {
          pvVar13 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>
                              (&this_01->column_ids,(size_type)__n_00);
          local_d0 = (ParquetReaderScanState *)pvVar13->column_id;
          pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                   ::operator->(this_00);
          pSVar19 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar7);
          this_03 = local_b8;
          if ((local_b8->
              super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
              .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
              (TableFilterSet *)0x0) {
            bVar24 = true;
          }
          else {
            this_06 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                       *)unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                         ::operator->(local_b8);
            need_to_read.super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p = __n_00;
            iVar21 = ::std::
                     _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                     ::find(this_06,(key_type *)&need_to_read);
            pTVar22 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                      ::operator->(this_03);
            bVar24 = (_Rb_tree_header *)iVar21._M_node ==
                     &(pTVar22->filters)._M_t._M_impl.super__Rb_tree_header;
          }
          bVar25 = local_d8 == (StructColumnReader *)0x0;
          pCVar15 = StructColumnReader::GetChildReader(pSVar19,(idx_t)local_d0);
          (*pCVar15->_vptr_ColumnReader[10])(pCVar15,this_04,(ulong)(byte)(bVar24 ^ 1U | bVar25));
        }
        ::std::
        _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
        ::clear((_Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
                 *)(this_04 + 7));
        if (local_d8 == (StructColumnReader *)0x0) {
          ReadAheadBuffer::Prefetch((ReadAheadBuffer *)(this_04 + 4));
        }
      }
      else if (local_d0->current_group_prefetched == false) {
        uVar20 = GetGroupCompressedSize(this,local_d0);
        if (uVar20 != 0) {
          iVar18 = GetGroupOffset(this,pPVar3);
          ThriftFileTransport::Prefetch((ThriftFileTransport *)this_04,iVar18,len);
        }
        pPVar3->current_group_prefetched = true;
      }
    }
    else {
      iVar18 = state->offset_in_group;
      pPVar6 = GetGroup(this,state);
      if (pPVar6->num_rows <= (long)iVar18) {
        lVar17 = state->current_group;
        goto LAB_01ebefd8;
      }
      pPVar6 = GetGroup(this,state);
      iVar18 = pPVar6->num_rows;
      iVar1 = state->offset_in_group;
      local_c0 = iVar18 - iVar1;
      if (0x7ff < local_c0) {
        local_c0 = 0x800;
      }
      result->count = local_c0;
      if (iVar18 == iVar1) goto LAB_01ebf027;
      pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(&state->root_reader);
      pPVar8 = ColumnReader::Reader(pCVar7);
      switchD_016d4fed::default
                ((state->define_buf).super_ByteBuffer.ptr,0,(state->define_buf).super_ByteBuffer.len
                );
      switchD_016d4fed::default
                ((state->repeat_buf).super_ByteBuffer.ptr,0,(state->repeat_buf).super_ByteBuffer.len
                );
      local_b8 = (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                  *)(state->define_buf).super_ByteBuffer.ptr;
      local_a0 = (state->repeat_buf).super_ByteBuffer.ptr;
      pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(&state->root_reader);
      local_d8 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar7);
      uVar4 = local_c0;
      if ((pPVar8->super_BaseFileReader).deletion_filter.
          super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>._M_t.
          super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>
          .super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl == (DeleteFilter *)0x0
          && (this->super_BaseFileReader).filters.
             super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
             .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
             (TableFilterSet *)0x0) {
        local_a8 = &(this->super_BaseFileReader).column_ids;
        uVar23 = 0;
        while (uVar23 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      .
                                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->super_BaseFileReader).column_ids.column_ids.
                                      super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      .
                                      super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          pvVar13 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>
                              (&local_a8->column_ids,uVar23);
          params.column_id = pvVar13->column_id;
          pvVar14 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar23);
          pCVar15 = StructColumnReader::GetChildReader(local_d8,params.column_id);
          iVar5 = (*pCVar15->_vptr_ColumnReader[3])(pCVar15,uVar4,local_b8,local_a0,pvVar14);
          uVar23 = uVar23 + 1;
          if (CONCAT44(extraout_var_00,iVar5) != uVar4) {
            this_05 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&need_to_read,
                       "Mismatch in parquet read for column %llu, expected %llu rows, got %llu",
                       (allocator *)&filter_count);
            InvalidInputException::
            InvalidInputException<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
                      (this_05,(string *)&need_to_read,params,local_c0,
                       CONCAT44(extraout_var_00,iVar5));
            __cxa_throw(this_05,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        filter_count = result->count;
        local_c1 = true;
        ::std::vector<bool,_std::allocator<bool>_>::vector
                  (&need_to_read.super_vector<bool,_std::allocator<bool>_>,
                   (long)(this->super_BaseFileReader).column_ids.column_ids.
                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         .
                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_BaseFileReader).column_ids.column_ids.
                         super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         .
                         super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,&local_c1,&local_c2);
        this_08 = &(pPVar8->super_BaseFileReader).deletion_filter;
        local_b0 = &state->sel;
        ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
                   &(state->sel).selection_data);
        (state->sel).sel_vector = (sel_t *)0x0;
        bVar24 = (this_08->
                 super_unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>)
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::DeleteFilter_*,_std::default_delete<duckdb::DeleteFilter>_>
                 .super__Head_base<0UL,_duckdb::DeleteFilter_*,_false>._M_head_impl ==
                 (DeleteFilter *)0x0;
        if (!bVar24) {
          iVar18 = state->offset_in_group;
          iVar1 = state->group_offset;
          pDVar9 = unique_ptr<duckdb::DeleteFilter,_std::default_delete<duckdb::DeleteFilter>,_true>
                   ::operator->(this_08);
          filter_count = (**(code **)(*(long *)pDVar9 + 0x10))
                                   (pDVar9,iVar1 + iVar18,local_c0,local_b0);
        }
        local_a8 = &(this->super_BaseFileReader).column_ids;
        if ((this->super_BaseFileReader).filters.
            super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
            .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl !=
            (TableFilterSet *)0x0) {
          local_98 = &state->adaptive_filter;
          pAVar10 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                    ::operator->(local_98);
          state_00 = AdaptiveFilter::BeginFilter(pAVar10);
          this_02 = &state->scan_filters;
          uVar23 = 0;
          while ((uVar23 < (ulong)(((long)(state->scan_filters).
                                          super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                          .
                                          super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(state->scan_filters).
                                         super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                         .
                                         super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x18) &&
                 (filter_count != 0))) {
            pAVar10 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                      ::operator->(local_98);
            pvVar11 = vector<unsigned_long,_true>::get<true>(&pAVar10->permutation,uVar23);
            pvVar12 = vector<duckdb::ParquetScanFilter,_true>::get<true>(this_02,*pvVar11);
            __n = pvVar12->filter_idx;
            pvVar13 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>
                                (&local_a8->column_ids,__n);
            iVar18 = pvVar13->column_id;
            pvVar14 = vector<duckdb::Vector,_true>::get<true>(&result->data,__n);
            pCVar15 = StructColumnReader::GetChildReader(local_d8,iVar18);
            pTVar2 = pvVar12->filter;
            pTVar16 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                      ::operator*(&pvVar12->filter_state);
            (*pCVar15->_vptr_ColumnReader[5])
                      (pCVar15,local_c0,local_b8,local_a0,pvVar14,pTVar2,pTVar16,local_b0,
                       &filter_count,(ulong)bVar24);
            rVar28 = vector<bool,_true>::get<true>(&need_to_read,__n);
            *rVar28._M_p = *rVar28._M_p & ~rVar28._M_mask;
            uVar23 = uVar23 + 1;
            bVar24 = false;
            state = local_d0;
          }
          pAVar10 = unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true>
                    ::operator->(local_98);
          AdaptiveFilter::EndFilter(pAVar10,state_00);
        }
        for (uVar23 = 0;
            uVar23 < (ulong)((long)(this->super_BaseFileReader).column_ids.column_ids.
                                   super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                   .
                                   super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_BaseFileReader).column_ids.column_ids.
                                   super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                   .
                                   super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar23 = uVar23 + 1) {
          rVar28 = vector<bool,_true>::get<true>(&need_to_read,uVar23);
          if ((*rVar28._M_p & rVar28._M_mask) != 0) {
            pvVar13 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>
                                (&local_a8->column_ids,uVar23);
            iVar18 = pvVar13->column_id;
            if (filter_count == 0) {
              pCVar15 = StructColumnReader::GetChildReader(local_d8,iVar18);
              (*pCVar15->_vptr_ColumnReader[6])(pCVar15,result->count);
            }
            else {
              pvVar14 = vector<duckdb::Vector,_true>::get<true>(&result->data,uVar23);
              pCVar15 = StructColumnReader::GetChildReader(local_d8,iVar18);
              (*pCVar15->_vptr_ColumnReader[4])
                        (pCVar15,result->count,local_b8,local_a0,pvVar14,local_b0,filter_count);
            }
          }
        }
        if (local_c0 != filter_count) {
          DataChunk::Slice(result,local_b0,filter_count);
        }
        ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  ((_Bvector_base<std::allocator<bool>_> *)&need_to_read);
      }
      LOCK();
      (this->rows_read).super___atomic_base<unsigned_long>._M_i =
           (this->rows_read).super___atomic_base<unsigned_long>._M_i + local_c0;
      UNLOCK();
      local_d0->offset_in_group = local_d0->offset_in_group + local_c0;
    }
    bVar24 = true;
  }
  else {
LAB_01ebf02b:
    bVar24 = false;
  }
  return bVar24;
}

Assistant:

bool ParquetReader::ScanInternal(ClientContext &context, ParquetReaderScanState &state, DataChunk &result) {
	if (state.finished) {
		return false;
	}

	// see if we have to switch to the next row group in the parquet file
	if (state.current_group < 0 || (int64_t)state.offset_in_group >= GetGroup(state).num_rows) {
		state.current_group++;
		state.offset_in_group = 0;

		auto &trans = reinterpret_cast<ThriftFileTransport &>(*state.thrift_file_proto->getTransport());
		trans.ClearPrefetch();
		state.current_group_prefetched = false;

		if ((idx_t)state.current_group == state.group_idx_list.size()) {
			state.finished = true;
			return false;
		}

		// TODO: only need this if we have a deletion vector?
		state.group_offset = GetRowGroupOffset(state.root_reader->Reader(), state.group_idx_list[state.current_group]);

		uint64_t to_scan_compressed_bytes = 0;
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			PrepareRowGroupBuffer(state, col_idx);

			auto file_col_idx = column_ids[col_idx];

			auto &root_reader = state.root_reader->Cast<StructColumnReader>();
			to_scan_compressed_bytes += root_reader.GetChildReader(file_col_idx).TotalCompressedSize();
		}

		auto &group = GetGroup(state);
		if (state.prefetch_mode && state.offset_in_group != (idx_t)group.num_rows) {
			uint64_t total_row_group_span = GetGroupSpan(state);

			double scan_percentage = (double)(to_scan_compressed_bytes) / static_cast<double>(total_row_group_span);

			if (to_scan_compressed_bytes > total_row_group_span) {
				throw IOException(
				    "The parquet file '%s' seems to have incorrectly set page offsets. This interferes with DuckDB's "
				    "prefetching optimization. DuckDB may still be able to scan this file by manually disabling the "
				    "prefetching mechanism using: 'SET disable_parquet_prefetching=true'.",
				    GetFileName());
			}

			if (!filters && scan_percentage > ParquetReaderPrefetchConfig::WHOLE_GROUP_PREFETCH_MINIMUM_SCAN) {
				// Prefetch the whole row group
				if (!state.current_group_prefetched) {
					auto total_compressed_size = GetGroupCompressedSize(state);
					if (total_compressed_size > 0) {
						trans.Prefetch(GetGroupOffset(state), total_row_group_span);
					}
					state.current_group_prefetched = true;
				}
			} else {
				// lazy fetching is when all tuples in a column can be skipped. With lazy fetching the buffer is only
				// fetched on the first read to that buffer.
				bool lazy_fetch = filters != nullptr;

				// Prefetch column-wise
				for (idx_t i = 0; i < column_ids.size(); i++) {
					auto col_idx = MultiFileLocalIndex(i);
					auto file_col_idx = column_ids[col_idx];
					auto &root_reader = state.root_reader->Cast<StructColumnReader>();

					bool has_filter = false;
					if (filters) {
						auto entry = filters->filters.find(col_idx);
						has_filter = entry != filters->filters.end();
					}
					root_reader.GetChildReader(file_col_idx).RegisterPrefetch(trans, !(lazy_fetch && !has_filter));
				}

				trans.FinalizeRegistration();

				if (!lazy_fetch) {
					trans.PrefetchRegistered();
				}
			}
		}
		return true;
	}

	auto scan_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, GetGroup(state).num_rows - state.offset_in_group);
	result.SetCardinality(scan_count);

	if (scan_count == 0) {
		state.finished = true;
		return false; // end of last group, we are done
	}

	auto &deletion_filter = state.root_reader->Reader().deletion_filter;

	state.define_buf.zero();
	state.repeat_buf.zero();

	auto define_ptr = (uint8_t *)state.define_buf.ptr;
	auto repeat_ptr = (uint8_t *)state.repeat_buf.ptr;

	auto &root_reader = state.root_reader->Cast<StructColumnReader>();

	if (filters || deletion_filter) {
		idx_t filter_count = result.size();
		D_ASSERT(filter_count == scan_count);
		vector<bool> need_to_read(column_ids.size(), true);

		state.sel.Initialize(nullptr);
		D_ASSERT(!filters || state.scan_filters.size() == filters->filters.size());

		bool is_first_filter = true;
		if (deletion_filter) {
			auto row_start = UnsafeNumericCast<row_t>(state.offset_in_group + state.group_offset);
			filter_count = deletion_filter->Filter(row_start, scan_count, state.sel);
			//! FIXME: does this need to be set?
			//! As part of 'DirectFilter' we also initialize reads of the child readers
			is_first_filter = false;
		}

		if (filters) {
			// first load the columns that are used in filters
			auto filter_state = state.adaptive_filter->BeginFilter();
			for (idx_t i = 0; i < state.scan_filters.size(); i++) {
				if (filter_count == 0) {
					// if no rows are left we can stop checking filters
					break;
				}
				auto &scan_filter = state.scan_filters[state.adaptive_filter->permutation[i]];
				auto local_idx = MultiFileLocalIndex(scan_filter.filter_idx);
				auto column_id = column_ids[local_idx];

				auto &result_vector = result.data[local_idx.GetIndex()];
				auto &child_reader = root_reader.GetChildReader(column_id);
				child_reader.Filter(scan_count, define_ptr, repeat_ptr, result_vector, scan_filter.filter,
				                    *scan_filter.filter_state, state.sel, filter_count, is_first_filter);
				need_to_read[local_idx.GetIndex()] = false;
				is_first_filter = false;
			}
			state.adaptive_filter->EndFilter(filter_state);
		}

		// we still may have to read some cols
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			if (!need_to_read[col_idx]) {
				continue;
			}
			auto file_col_idx = column_ids[col_idx];
			if (filter_count == 0) {
				root_reader.GetChildReader(file_col_idx).Skip(result.size());
				continue;
			}
			auto &result_vector = result.data[i];
			auto &child_reader = root_reader.GetChildReader(file_col_idx);
			child_reader.Select(result.size(), define_ptr, repeat_ptr, result_vector, state.sel, filter_count);
		}
		if (scan_count != filter_count) {
			result.Slice(state.sel, filter_count);
		}
	} else {
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto col_idx = MultiFileLocalIndex(i);
			auto file_col_idx = column_ids[col_idx];
			auto &result_vector = result.data[i];
			auto &child_reader = root_reader.GetChildReader(file_col_idx);
			auto rows_read = child_reader.Read(scan_count, define_ptr, repeat_ptr, result_vector);
			if (rows_read != scan_count) {
				throw InvalidInputException("Mismatch in parquet read for column %llu, expected %llu rows, got %llu",
				                            file_col_idx, scan_count, rows_read);
			}
		}
	}

	rows_read += scan_count;
	state.offset_in_group += scan_count;
	return true;
}